

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iso8601.c
# Opt level: O1

_Bool get_tok(char *terminals,char **ptr,int32_t *remaining,char **out,int32_t *out_len)

{
  int iVar1;
  bool bVar2;
  char *pcVar3;
  int iVar4;
  char cVar5;
  int32_t iVar6;
  
  if (*remaining == 0) {
    *out = "";
    *out_len = 0;
  }
  *out = *ptr;
  *out_len = -1;
  iVar4 = *remaining;
  if (iVar4 == 0) {
    iVar6 = 0;
    bVar2 = false;
  }
  else {
    bVar2 = false;
    do {
      cVar5 = *terminals;
      if (cVar5 != '\0') {
        pcVar3 = terminals + 1;
        do {
          if (**ptr == cVar5) {
            bVar2 = true;
            break;
          }
          cVar5 = *pcVar3;
          pcVar3 = pcVar3 + 1;
        } while (cVar5 != '\0');
      }
      *ptr = *ptr + 1;
      *remaining = iVar4 + -1;
      iVar1 = *out_len;
      *out_len = iVar1 + 1;
      iVar4 = *remaining;
    } while ((iVar4 != 0) && (!bVar2));
    iVar6 = iVar1 + 2;
  }
  if (bVar2 == false) {
    *out_len = iVar6;
  }
  return bVar2;
}

Assistant:

static bool
get_tok (const char *terminals,
         const char **ptr,
         int32_t *remaining,
         const char **out,
         int32_t *out_len)
{
   const char *terminal;
   bool found_terminal = false;

   if (!*remaining) {
      *out = "";
      *out_len = 0;
   }

   *out = *ptr;
   *out_len = -1;

   for (; *remaining && !found_terminal;
        (*ptr)++, (*remaining)--, (*out_len)++) {
      for (terminal = terminals; *terminal; terminal++) {
         if (**ptr == *terminal) {
            found_terminal = true;
            break;
         }
      }
   }

   if (!found_terminal) {
      (*out_len)++;
   }

   return found_terminal;
}